

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_solution.hpp
# Opt level: O1

Spins * __thiscall
openjij::result::get_solution<openjij::graph::Dense<double>>
          (Spins *__return_storage_ptr__,result *this,
          ClassicalIsing<openjij::graph::Dense<double>_> *system)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  allocator_type local_11;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(size_type *)(this + 0x28),&local_11);
  lVar1 = *(long *)(this + 0x28);
  if (lVar1 != 0) {
    lVar2 = *(long *)this;
    lVar3 = *(long *)(this + 8);
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    lVar5 = lVar3;
    if (lVar3 < 1) {
      lVar5 = lVar6;
    }
    do {
      if ((lVar5 == lVar6) || (lVar3 <= lVar1 || lVar1 < 0)) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      piVar4[lVar6] = (int)(*(double *)(lVar2 + lVar6 * 8) * *(double *)(lVar2 + lVar1 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const graph::Spins
get_solution(const system::ClassicalIsing<GraphType> &system) {
  // convert from Eigen::Vector to std::vector
  graph::Spins ret_spins(system.num_spins);
  for (std::size_t i = 0; i < system.num_spins; i++) {
    ret_spins[i] = static_cast<graph::Spin>(system.spin(i) *
                                            system.spin(system.num_spins));
  }
  return ret_spins;
}